

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O1

uint8_t get_color(uint8_t a,int attr,int n)

{
  int iVar1;
  
  if ((0 < n && -1 < (char)a) && attr != 0) {
    iVar1 = n + 1;
    do {
      a = *(byte *)((long)attr + (ulong)a * 0x2a + 0x28ffc1);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  return a;
}

Assistant:

uint8_t get_color(uint8_t a, int attr, int n)
{
	/* Accept any graphical attr (high bit set) */
	if (a & (0x80))
		return (a);

	/* TODO: Honour the attribute for the term (full color, mono, 16 color) */
	if (!attr)
		return (a);

	/* Translate the color N times */
	while (n > 0) {
		a = color_table[a].color_translate[attr];
		n--;
	}

	/* Return the modified color */
	return (a);
}